

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::Qrt(BN *__return_storage_ptr__,BN *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  allocator_type local_29;
  
  uVar5 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < 0x20001fff2) {
    fastQrt(__return_storage_ptr__,this);
  }
  else {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&__return_storage_ptr__->ba,uVar5 | 1,&local_29);
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar3 != 0) {
      uVar4 = lVar3 >> 1;
      puVar1 = (__return_storage_ptr__->ba).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = puVar1;
      puVar7 = puVar2;
      uVar5 = 0;
      do {
        uVar10 = (ulong)puVar2[uVar5] * (ulong)puVar2[uVar5] + (ulong)puVar1[uVar5 * 2];
        uVar8 = uVar10 & 0xffffffff;
        puVar1[uVar5 * 2] = (unsigned_short)uVar10;
        uVar10 = uVar5 + 1;
        if (uVar10 < uVar4) {
          lVar3 = 1;
          do {
            uVar8 = (uVar8 >> 0x10) + (ulong)puVar6[lVar3] +
                    (ulong)((uint)puVar2[uVar5] * 2) * (ulong)puVar7[lVar3];
            puVar6[lVar3] = (unsigned_short)uVar8;
            lVar9 = uVar5 + lVar3;
            lVar3 = lVar3 + 1;
          } while (lVar9 + 1U < uVar4);
        }
        lVar3 = uVar5 + uVar4;
        lVar9 = (uVar8 >> 0x10) + (ulong)puVar1[lVar3];
        puVar1[lVar3] = (unsigned_short)lVar9;
        puVar1[lVar3 + 1] = puVar1[lVar3 + 1] + (short)((ulong)lVar9 >> 0x10);
        puVar7 = puVar7 + 1;
        puVar6 = puVar6 + 2;
        uVar5 = uVar10;
      } while (uVar10 != uVar4 + (uVar4 == 0));
    }
    puVar2 = (__return_storage_ptr__->ba).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = (long)puVar2 -
            (long)(__return_storage_ptr__->ba).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    while ((2 < uVar5 && (puVar2 = puVar2 + -1, *puVar2 == 0))) {
      (__return_storage_ptr__->ba).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
      uVar5 = uVar5 - 2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::Qrt() const
{
    if (ba.size() < MaximalSizeForFastMul)
        return fastQrt();

    BN res(2 * ba.size() + 1, 0);
    for (size_t i = 0; i < ba.size(); ++i) {
        bt4 cuv = res.ba[2 * i] + static_cast<bt2>(ba[i]) * ba[i];
        res.ba[2 * i] = cuv;
        for (size_t j = i + 1; j < ba.size(); ++j) {
            cuv = static_cast<bt4>(res.ba[i + j]) +
                ((static_cast<bt4>(ba[i]) * ba[j]) << 1) +
                (cuv >> bz8);
            res.ba[i + j] = cuv;
        }
        cuv = res.ba[i + ba.size()] + (cuv >> bz8);
        res.ba[i + ba.size()] = cuv;
        res.ba[i + ba.size() + 1] += (cuv >> bz8);
    }
    Norm(res.ba);
    return res;
}